

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

HalfedgeMesh * __thiscall CMU462::HalfedgeMesh::operator=(HalfedgeMesh *this,HalfedgeMesh *mesh)

{
  bool bVar1;
  pointer pHVar2;
  VertexIter *pVVar3;
  mapped_type *pmVar4;
  EdgeIter *pEVar5;
  mapped_type *pmVar6;
  FaceIter *pFVar7;
  mapped_type *pmVar8;
  pointer pVVar9;
  pointer pEVar10;
  pointer pFVar11;
  HalfedgeIter *pHVar12;
  mapped_type *pmVar13;
  HalfedgeMesh *in_RDI;
  FaceIter b_1;
  FaceIter f_1;
  EdgeIter e_1;
  VertexIter v_1;
  HalfedgeIter he;
  FaceCIter b;
  FaceCIter f;
  EdgeCIter e;
  VertexCIter v;
  HalfedgeCIter h;
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  faceOldToNew;
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  edgeOldToNew;
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  vertexOldToNew;
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  halfedgeOldToNew;
  HalfedgeMesh *in_stack_fffffffffffffb38;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *in_stack_fffffffffffffb40;
  value_type *in_stack_fffffffffffffb58;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *in_stack_fffffffffffffb60;
  const_iterator in_stack_fffffffffffffb68;
  mapped_type *in_stack_fffffffffffffb78;
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  *in_stack_fffffffffffffb80;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> local_288;
  _List_node_base *local_270;
  _List_const_iterator<CMU462::Halfedge> local_268;
  _Self local_260;
  _Self local_258;
  _List_node_base *local_250;
  _List_const_iterator<CMU462::Halfedge> local_248;
  _Self local_240;
  _Self local_238;
  _List_node_base *local_230;
  _List_const_iterator<CMU462::Halfedge> local_228;
  _Self local_220;
  _Self local_218;
  _List_node_base *local_210;
  _List_const_iterator<CMU462::Face> local_208;
  _List_const_iterator<CMU462::Edge> local_200;
  _List_const_iterator<CMU462::Vertex> local_1f8;
  _List_const_iterator<CMU462::Halfedge> local_1f0;
  _List_const_iterator<CMU462::Halfedge> local_1e8;
  _Self local_1e0;
  _Self local_1d8;
  _List_node_base *local_1d0;
  iterator local_1c8;
  _List_const_iterator<CMU462::Face> local_1c0;
  _List_node_base *local_1b8;
  _Self local_1b0;
  _Self local_1a8;
  _List_node_base *local_1a0;
  iterator local_198;
  _List_const_iterator<CMU462::Face> local_190;
  _List_node_base *local_188;
  _Self local_180;
  _Self local_178;
  _List_node_base *local_170;
  iterator local_168;
  _List_const_iterator<CMU462::Edge> local_160;
  _List_node_base *local_158;
  _Self local_150;
  _Self local_148;
  _List_node_base *local_140;
  iterator local_138;
  _List_const_iterator<CMU462::Vertex> local_130;
  _List_node_base *local_128;
  _Self local_120;
  _Self local_118;
  _List_node_base *local_110;
  iterator local_108;
  _List_const_iterator<CMU462::Halfedge> local_100;
  _List_node_base *local_f8;
  _Self local_f0 [3];
  _Self local_d8 [27];
  
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear
            ((list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)in_stack_fffffffffffffb40)
  ;
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear
            ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)in_stack_fffffffffffffb40);
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(in_stack_fffffffffffffb40);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)in_stack_fffffffffffffb40);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)in_stack_fffffffffffffb40);
  std::
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
         *)0x23026d);
  std::
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
         *)0x23027a);
  std::
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
         *)0x230287);
  std::
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  ::map((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
         *)0x230294);
  local_d8[0]._M_node = (_List_node_base *)halfedgesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_f0[0]._M_node = (_List_node_base *)halfedgesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(local_d8,local_f0);
    if (!bVar1) break;
    local_108._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                   (&in_stack_fffffffffffffb38->halfedges);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_100,&local_108);
    std::_List_const_iterator<CMU462::Halfedge>::operator*
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    local_f8 = (_List_node_base *)
               std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::insert
                         ((list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_> *)
                          in_stack_fffffffffffffb60,in_stack_fffffffffffffb68._M_node,
                          (value_type *)in_stack_fffffffffffffb58);
    pmVar13 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[](in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pmVar13->_M_node = local_f8;
    local_110 = (_List_node_base *)
                std::_List_const_iterator<CMU462::Halfedge>::operator++(local_d8,0);
  }
  local_118._M_node = (_List_node_base *)verticesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_120._M_node = (_List_node_base *)verticesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_118,&local_120);
    if (!bVar1) break;
    local_138._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::end
                   ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                    in_stack_fffffffffffffb38);
    std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_130,&local_138);
    std::_List_const_iterator<CMU462::Vertex>::operator*
              ((_List_const_iterator<CMU462::Vertex> *)0x2304b3);
    local_128 = (_List_node_base *)
                std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::insert
                          ((list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                           in_stack_fffffffffffffb60,in_stack_fffffffffffffb68._M_node,
                           in_stack_fffffffffffffb58);
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                           *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pmVar4->_M_node = local_128;
    local_140 = (_List_node_base *)
                std::_List_const_iterator<CMU462::Vertex>::operator++(&local_118,0);
  }
  local_148._M_node = (_List_node_base *)edgesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_150._M_node = (_List_node_base *)edgesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_148,&local_150);
    if (!bVar1) break;
    local_168._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::end
                   ((list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)in_stack_fffffffffffffb38);
    std::_List_const_iterator<CMU462::Edge>::_List_const_iterator(&local_160,&local_168);
    std::_List_const_iterator<CMU462::Edge>::operator*
              ((_List_const_iterator<CMU462::Edge> *)in_stack_fffffffffffffb40);
    local_158 = (_List_node_base *)
                std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::insert
                          (in_stack_fffffffffffffb60,in_stack_fffffffffffffb68._M_node,
                           (value_type *)in_stack_fffffffffffffb58);
    pmVar6 = std::
             map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                           *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pmVar6->_M_node = local_158;
    local_170 = (_List_node_base *)std::_List_const_iterator<CMU462::Edge>::operator++(&local_148,0)
    ;
  }
  local_178._M_node = (_List_node_base *)facesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_180._M_node = (_List_node_base *)facesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_178,&local_180);
    if (!bVar1) break;
    local_198._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::end
                   ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)in_stack_fffffffffffffb38);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_190,&local_198);
    std::_List_const_iterator<CMU462::Face>::operator*
              ((_List_const_iterator<CMU462::Face> *)in_stack_fffffffffffffb40);
    local_188 = (_List_node_base *)
                std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::insert
                          ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)
                           in_stack_fffffffffffffb60,in_stack_fffffffffffffb68,
                           (value_type *)in_stack_fffffffffffffb58);
    pmVar8 = std::
             map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                           *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pmVar8->_M_node = local_188;
    local_1a0 = (_List_node_base *)std::_List_const_iterator<CMU462::Face>::operator++(&local_178,0)
    ;
  }
  local_1a8._M_node = (_List_node_base *)boundariesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_1b0._M_node = (_List_node_base *)boundariesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_1a8,&local_1b0);
    if (!bVar1) break;
    local_1c8._M_node =
         (_List_node_base *)
         std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::end
                   ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)in_stack_fffffffffffffb38);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_1c0,&local_1c8);
    std::_List_const_iterator<CMU462::Face>::operator*
              ((_List_const_iterator<CMU462::Face> *)in_stack_fffffffffffffb40);
    local_1b8 = (_List_node_base *)
                std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::insert
                          ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)
                           in_stack_fffffffffffffb60,in_stack_fffffffffffffb68,
                           (value_type *)in_stack_fffffffffffffb58);
    pmVar8 = std::
             map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                           *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pmVar8->_M_node = local_1b8;
    local_1d0 = (_List_node_base *)std::_List_const_iterator<CMU462::Face>::operator++(&local_1a8,0)
    ;
  }
  local_1d8._M_node = (_List_node_base *)halfedgesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_1e0._M_node = (_List_node_base *)halfedgesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_1d8,&local_1e0);
    if (!bVar1) break;
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pHVar12 = Halfedge::next(pHVar2);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_1e8,pHVar12);
    pmVar13 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[](in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pHVar12 = Halfedge::next(pHVar2);
    pHVar12->_M_node = pmVar13->_M_node;
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pHVar12 = Halfedge::twin(pHVar2);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_1f0,pHVar12);
    pmVar13 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[](in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pHVar12 = Halfedge::twin(pHVar2);
    pHVar12->_M_node = pmVar13->_M_node;
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pVVar3 = Halfedge::vertex(pHVar2);
    std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_1f8,pVVar3);
    pmVar4 = std::
             map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
                           *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pVVar3 = Halfedge::vertex(pHVar2);
    pVVar3->_M_node = pmVar4->_M_node;
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pEVar5 = Halfedge::edge(pHVar2);
    std::_List_const_iterator<CMU462::Edge>::_List_const_iterator(&local_200,pEVar5);
    pmVar6 = std::
             map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
                           *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pEVar5 = Halfedge::edge(pHVar2);
    pEVar5->_M_node = pmVar6->_M_node;
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pFVar7 = Halfedge::face(pHVar2);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_208,pFVar7);
    pmVar8 = std::
             map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
             ::operator[]((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
                           *)in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                       ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40);
    pFVar7 = Halfedge::face(pHVar2);
    pFVar7->_M_node = pmVar8->_M_node;
    local_210 = (_List_node_base *)std::_List_iterator<CMU462::Halfedge>::operator++(&local_1d8,0);
  }
  local_218._M_node = (_List_node_base *)verticesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_220._M_node = (_List_node_base *)verticesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_218,&local_220);
    if (!bVar1) break;
    pVVar9 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffb40);
    pHVar12 = Vertex::halfedge(pVVar9);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_228,pHVar12);
    pmVar13 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[](in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pVVar9 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffb40);
    pHVar12 = Vertex::halfedge(pVVar9);
    pHVar12->_M_node = pmVar13->_M_node;
    local_230 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_218,0);
  }
  local_238._M_node = (_List_node_base *)edgesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_240._M_node = (_List_node_base *)edgesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_238,&local_240);
    if (!bVar1) break;
    pEVar10 = std::_List_iterator<CMU462::Edge>::operator->
                        ((_List_iterator<CMU462::Edge> *)0x230da9);
    pHVar12 = Edge::halfedge(pEVar10);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator(&local_248,pHVar12);
    pmVar13 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[](in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pEVar10 = std::_List_iterator<CMU462::Edge>::operator->
                        ((_List_iterator<CMU462::Edge> *)0x230df5);
    pHVar12 = Edge::halfedge(pEVar10);
    pHVar12->_M_node = pmVar13->_M_node;
    local_250 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_238,0);
  }
  local_258._M_node = (_List_node_base *)facesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_260._M_node = (_List_node_base *)facesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=(&local_258,&local_260);
    if (!bVar1) break;
    pFVar11 = std::_List_iterator<CMU462::Face>::operator->
                        ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffb40);
    in_stack_fffffffffffffb80 =
         (map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
          *)Face::halfedge(pFVar11);
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator
              (&local_268,(iterator *)in_stack_fffffffffffffb80);
    in_stack_fffffffffffffb78 =
         std::
         map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
         ::operator[](in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pFVar11 = std::_List_iterator<CMU462::Face>::operator->
                        ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffb40);
    pHVar12 = Face::halfedge(pFVar11);
    pHVar12->_M_node = in_stack_fffffffffffffb78->_M_node;
    local_270 = (_List_node_base *)std::_List_iterator<CMU462::Face>::operator++(&local_258,0);
  }
  local_288.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node._M_size =
       (size_t)boundariesBegin(in_stack_fffffffffffffb38);
  while( true ) {
    local_288.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)boundariesEnd(in_stack_fffffffffffffb38);
    bVar1 = std::operator!=((_Self *)&local_288.
                                      super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                                      _M_impl._M_node._M_size,
                            (_Self *)&local_288.
                                      super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>.
                                      _M_impl._M_node.super__List_node_base._M_prev);
    if (!bVar1) break;
    pFVar11 = std::_List_iterator<CMU462::Face>::operator->
                        ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffb40);
    pHVar12 = Face::halfedge(pFVar11);
    in_stack_fffffffffffffb40 = &local_288;
    std::_List_const_iterator<CMU462::Halfedge>::_List_const_iterator
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffb40,pHVar12);
    pmVar13 = std::
              map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator[](in_stack_fffffffffffffb80,(key_type *)in_stack_fffffffffffffb78);
    pFVar11 = std::_List_iterator<CMU462::Face>::operator->
                        ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffb40);
    in_stack_fffffffffffffb38 = (HalfedgeMesh *)Face::halfedge(pFVar11);
    (in_stack_fffffffffffffb38->halfedges).
    super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
    super__List_node_base._M_next = pmVar13->_M_node;
    std::_List_iterator<CMU462::Face>::operator++
              ((_List_iterator<CMU462::Face> *)
               &local_288.super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
                _M_node._M_size,0);
  }
  std::
  map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>,_std::less<std::_List_const_iterator<CMU462::Face>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Face>,_std::_List_iterator<CMU462::Face>_>_>_>
          *)0x231023);
  std::
  map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>,_std::less<std::_List_const_iterator<CMU462::Edge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Edge>,_std::_List_iterator<CMU462::Edge>_>_>_>
          *)0x231030);
  std::
  map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>,_std::less<std::_List_const_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Vertex>,_std::_List_iterator<CMU462::Vertex>_>_>_>
          *)0x23103d);
  std::
  map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::~map((map<std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::_List_const_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_const_iterator<CMU462::Halfedge>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
          *)0x23104a);
  return in_RDI;
}

Assistant:

const HalfedgeMesh& HalfedgeMesh::operator=(const HalfedgeMesh& mesh)
// The assignment operator does a "deep" copy of the halfedge mesh data
// structure; in other words, it makes new instances of each mesh element, and
// ensures that pointers in the copy point to the newly allocated elements
// rather than elements in the original mesh.  This behavior is especially
// important for making assignments, since the mesh on the right-hand side of an
// assignment may be temporary (hence any pointers to elements in this mesh will
// become invalid as soon as it is released.)
{
  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // These maps will be used to identify elements of the old mesh
  // with elements of the new mesh.  (Note that we can use a single
  // map for both interior and boundary faces, because the map
  // doesn't care which list of faces these iterators come from.)
  map<HalfedgeCIter, HalfedgeIter> halfedgeOldToNew;
  map<VertexCIter, VertexIter> vertexOldToNew;
  map<EdgeCIter, EdgeIter> edgeOldToNew;
  map<FaceCIter, FaceIter> faceOldToNew;

  // Copy geometry from the original mesh and create a map from
  // pointers in the original mesh to those in the new mesh.
  for (HalfedgeCIter h = mesh.halfedgesBegin(); h != mesh.halfedgesEnd(); h++)
    halfedgeOldToNew[h] = halfedges.insert(halfedges.end(), *h);
  for (VertexCIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++)
    vertexOldToNew[v] = vertices.insert(vertices.end(), *v);
  for (EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++)
    edgeOldToNew[e] = edges.insert(edges.end(), *e);
  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++)
    faceOldToNew[f] = faces.insert(faces.end(), *f);
  for (FaceCIter b = mesh.boundariesBegin(); b != mesh.boundariesEnd(); b++)
    faceOldToNew[b] = boundaries.insert(boundaries.end(), *b);

  // "Search and replace" old pointers with new ones.
  for (HalfedgeIter he = halfedgesBegin(); he != halfedgesEnd(); he++) {
    he->next() = halfedgeOldToNew[he->next()];
    he->twin() = halfedgeOldToNew[he->twin()];
    he->vertex() = vertexOldToNew[he->vertex()];
    he->edge() = edgeOldToNew[he->edge()];
    he->face() = faceOldToNew[he->face()];
  }
  for (VertexIter v = verticesBegin(); v != verticesEnd(); v++)
    v->halfedge() = halfedgeOldToNew[v->halfedge()];
  for (EdgeIter e = edgesBegin(); e != edgesEnd(); e++)
    e->halfedge() = halfedgeOldToNew[e->halfedge()];
  for (FaceIter f = facesBegin(); f != facesEnd(); f++)
    f->halfedge() = halfedgeOldToNew[f->halfedge()];
  for (FaceIter b = boundariesBegin(); b != boundariesEnd(); b++)
    b->halfedge() = halfedgeOldToNew[b->halfedge()];

  // Return a reference to the new mesh.
  return *this;
}